

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

int Extra_Power3(int Num)

{
  undefined4 local_14;
  undefined4 local_10;
  int Res;
  int i;
  int Num_local;
  
  local_14 = 1;
  for (local_10 = 0; local_10 < Num; local_10 = local_10 + 1) {
    local_14 = local_14 * 3;
  }
  return local_14;
}

Assistant:

int Extra_Power3( int Num )
{
    int i;
    int Res;
    Res = 1;
    for ( i = 0; i < Num; i++ )
        Res *= 3;
    return Res;
}